

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

iterator __thiscall
google::protobuf::RepeatedField<double>::erase
          (RepeatedField<double> *this,const_iterator first,const_iterator last)

{
  int iVar1;
  const_iterator pdVar2;
  iterator pdVar3;
  double *pdVar4;
  size_type first_offset;
  const_iterator last_local;
  const_iterator first_local;
  RepeatedField<double> *this_local;
  
  pdVar2 = cbegin(this);
  iVar1 = (int)((long)first - (long)pdVar2 >> 3);
  if (first != last) {
    pdVar2 = cend(this);
    pdVar3 = begin(this);
    pdVar4 = std::copy<double_const*,double*>(last,pdVar2,pdVar3 + iVar1);
    pdVar2 = cbegin(this);
    Truncate(this,(int)((long)pdVar4 - (long)pdVar2 >> 3));
  }
  pdVar3 = begin(this);
  return pdVar3 + iVar1;
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator first, const_iterator last) {
  size_type first_offset = first - cbegin();
  if (first != last) {
    Truncate(std::copy(last, cend(), begin() + first_offset) - cbegin());
  }
  return begin() + first_offset;
}